

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatLut.c
# Opt level: O2

int Sbl_ManEvaluateMapping(Sbl_Man_t *p,int DelayGlo)

{
  int iVar1;
  int iVar2;
  int iVar3;
  abctime aVar4;
  Vec_Int_t *pVVar5;
  abctime aVar6;
  int iVar7;
  
  aVar4 = Abc_Clock();
  if (p->pGia->vEdge1 != (Vec_Int_t *)0x0) {
    iVar1 = Sbl_ManEvaluateMappingEdge(p,DelayGlo);
    return iVar1;
  }
  p->vPath->nSize = 0;
  Sbl_ManCreateTiming(p,DelayGlo);
  Sbl_ManGetCurrentMapping(p);
  iVar1 = -1;
  for (iVar7 = 0; iVar7 < p->vAnds->nSize; iVar7 = iVar7 + 1) {
    iVar1 = Vec_IntEntry(p->vAnds,iVar7);
    iVar2 = iVar7;
    pVVar5 = Vec_WecEntry(p->vWindow,iVar7);
    iVar2 = Sbl_ManComputeDelay(p,iVar2,pVVar5);
    Vec_IntWriteEntry(p->vArrs,iVar1,iVar2);
  }
  for (iVar7 = 0; iVar7 < p->vRoots->nSize; iVar7 = iVar7 + 1) {
    iVar1 = Vec_IntEntry(p->vRoots,iVar7);
    iVar2 = Vec_IntEntry(p->vArrs,iVar1);
    iVar3 = Vec_IntEntry(p->vReqs,iVar1);
    if (iVar3 < iVar2) break;
  }
  aVar6 = Abc_Clock();
  p->timeTime = p->timeTime + (aVar6 - aVar4);
  if (p->vRoots->nSize == iVar7) {
    iVar1 = 1;
  }
  else {
    iVar2 = Vec_IntFind(p->vAnds,iVar1);
    if (iVar2 < 0) {
      __assert_fail("iAnd >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                    ,499,"int Sbl_ManEvaluateMapping(Sbl_Man_t *, int)");
    }
    iVar7 = Vec_IntEntry(p->vRootVars,iVar7);
    if (iVar2 != iVar7) {
      __assert_fail("iAnd == Vec_IntEntry(p->vRootVars, i)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                    ,0x1f5,"int Sbl_ManEvaluateMapping(Sbl_Man_t *, int)");
    }
    do {
      pVVar5 = p->vPath;
      iVar7 = Abc_Var2Lit(iVar2,1);
      Vec_IntPush(pVVar5,iVar7);
      pVVar5 = Vec_WecEntry(p->vWindow,iVar2);
      iVar1 = Sbl_ManCriticalFanin(p,iVar1,pVVar5);
      if (iVar1 < 1) {
        __assert_fail("iLut > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                      ,0x1fd,"int Sbl_ManEvaluateMapping(Sbl_Man_t *, int)");
      }
      iVar2 = Vec_IntFind(p->vAnds,iVar1);
    } while (iVar2 != -1);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int Sbl_ManEvaluateMapping( Sbl_Man_t * p, int DelayGlo )
{
    abctime clk = Abc_Clock();
    Vec_Int_t * vFanins;
    int i, iLut = -1, iAnd, Delay, Required;
    if ( p->pGia->vEdge1 )
        return Sbl_ManEvaluateMappingEdge( p, DelayGlo );
    Vec_IntClear( p->vPath );
    // derive timing
    Sbl_ManCreateTiming( p, DelayGlo );
    // update new timing
    Sbl_ManGetCurrentMapping( p );
    Vec_IntForEachEntry( p->vAnds, iLut, i )
    {
        vFanins = Vec_WecEntry( p->vWindow, i );
        Delay   = Sbl_ManComputeDelay( p, iLut, vFanins );
        Vec_IntWriteEntry( p->vArrs, iLut, Delay );
    }
    // compare timing at the root nodes
    Vec_IntForEachEntry( p->vRoots, iLut, i )
    {
        Delay    = Vec_IntEntry( p->vArrs, iLut );
        Required = Vec_IntEntry( p->vReqs, iLut );
        if ( Delay > Required ) // updated timing exceeded original timing
            break;
    }
    p->timeTime += Abc_Clock() - clk;
    if ( i == Vec_IntSize(p->vRoots) )
        return 1;
    // derive the critical path

    // find SAT variable of the node whose GIA ID is "iLut"
    iAnd = Vec_IntFind( p->vAnds, iLut );
    assert( iAnd >= 0 );
    // critical path begins in node "iLut", which is i-th root of the window
    assert( iAnd == Vec_IntEntry(p->vRootVars, i) );
    while ( 1 )
    {
        Vec_IntPush( p->vPath, Abc_Var2Lit(iAnd, 1) );
        // find fanins of this node
        vFanins = Vec_WecEntry( p->vWindow, iAnd );
        // find critical fanin
        iLut = Sbl_ManCriticalFanin( p, iLut, vFanins );
        assert( iLut > 0  );
        // find SAT variable of the node whose GIA ID is "iLut"
        iAnd = Vec_IntFind( p->vAnds, iLut );
        if ( iAnd == -1 )
            break;
    }
    return 0;
}